

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

int Extra_ReadHexadecimal(uint *Sign,char *pString,int nVars)

{
  int iVar1;
  int local_28;
  int local_24;
  int k;
  int nDigits;
  int nWords;
  int nVars_local;
  char *pString_local;
  uint *Sign_local;
  
  iVar1 = Extra_TruthWordNum(nVars);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    Sign[local_28] = 0;
  }
  local_24 = (1 << ((byte)nVars & 0x1f)) / 4;
  if (local_24 == 0) {
    local_24 = 1;
  }
  Extra_ReadHex(Sign,pString,local_24);
  return 1;
}

Assistant:

int Extra_ReadHexadecimal( unsigned Sign[], char * pString, int nVars )
{
    int nWords, nDigits, k;
    nWords = Extra_TruthWordNum( nVars );
    for ( k = 0; k < nWords; k++ )
        Sign[k] = 0;
    // read the number from the string
    nDigits = (1 << nVars) / 4;
    if ( nDigits == 0 )
        nDigits = 1;
    Extra_ReadHex( Sign, pString, nDigits );
    return 1;
}